

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O2

size_t utf8::DecodeUnitsInto
                 (char16 *buffer,LPCUTF8 *pbUtf8,LPCUTF8 pbEnd,DecodeOptions options,
                 bool *chunkEndsAtTruncatedSequence)

{
  uint uVar1;
  uint *puVar2;
  char16 cVar3;
  char16 *pcVar4;
  char16 *pcVar5;
  long lVar6;
  undefined1 in_XMM0 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar7 [16];
  undefined1 in_XMM1 [16];
  DecodeOptions local_3c;
  uint *puStack_38;
  DecodeOptions localOptions;
  LPCUTF8 p;
  
  if (chunkEndsAtTruncatedSequence != (bool *)0x0) {
    *chunkEndsAtTruncatedSequence = false;
  }
  puStack_38 = (uint *)*pbUtf8;
  pcVar5 = buffer;
  local_3c = options;
  if ((((uint)puStack_38 | (uint)buffer) & 3) == 0) goto LAB_006080f8;
  do {
    lVar6 = (long)pcVar5 - (long)buffer;
    pcVar4 = pcVar5;
    do {
      puVar2 = puStack_38;
      pcVar4 = pcVar4 + 1;
      if ((pbEnd <= puStack_38) ||
         (cVar3 = Decode((LPCUTF8 *)&stack0xffffffffffffffc8,pbEnd,&local_3c,
                         chunkEndsAtTruncatedSequence), puStack_38 <= puVar2)) {
        *pbUtf8 = (LPCUTF8)puStack_38;
        return lVar6 >> 1;
      }
      *pcVar5 = cVar3;
      pcVar5 = pcVar5 + 1;
      lVar6 = lVar6 + 2;
      in_XMM0 = extraout_XMM0;
    } while ((((uint)puStack_38 | (uint)pcVar4) & 3) != 0);
LAB_006080f8:
    auVar7 = pmovsxbd(in_XMM0,0x7f7f7f7f);
    in_XMM1 = pmovsxbw(in_XMM1,0x7f007f007f007f00);
    for (; ((LPCUTF8)((long)puStack_38 + 3U) < pbEnd &&
           (uVar1 = *puStack_38, (uVar1 & 0x80808080) == 0)); puStack_38 = puStack_38 + 1) {
      *(ulong *)pcVar5 =
           CONCAT44((uVar1 >> 0x10) << 8,uVar1 << 8) & in_XMM1._0_8_ |
           CONCAT44(uVar1 >> 0x10,uVar1) & auVar7._0_8_;
      pcVar5 = pcVar5 + 4;
    }
  } while( true );
}

Assistant:

_Use_decl_annotations_
    size_t DecodeUnitsInto(char16 *buffer, LPCUTF8& pbUtf8, LPCUTF8 pbEnd, DecodeOptions options, bool *chunkEndsAtTruncatedSequence)
    {
        DecodeOptions localOptions = options;

        if (chunkEndsAtTruncatedSequence)
        {
            *chunkEndsAtTruncatedSequence = false;
        }

        LPCUTF8 p = pbUtf8;
        char16 *dest = buffer;

        if (!ShouldFastPath(p, dest)) goto LSlowPath;

LFastPath:
        while (p + 3 < pbEnd)
        {
            unsigned bytes = *(unsigned *)p;
            if ((bytes & 0x80808080) != 0) goto LSlowPath;
            ((uint32 *)dest)[0] = (char16(bytes) & 0x00FF) | ((char16(bytes) & 0xFF00) << 8);
            ((uint32 *)dest)[1] = (char16(bytes >> 16) & 0x00FF) | ((char16(bytes >> 16) & 0xFF00) << 8);
            p += 4;
            dest += 4;
        }

LSlowPath:
        while (p < pbEnd)
        {
            LPCUTF8 s = p;
            char16 chDest = Decode(p, pbEnd, localOptions, chunkEndsAtTruncatedSequence);

            if (s < p)
            {
                // We decoded the character, store it
                *dest++ = chDest;
            }
            else
            {
                // Nothing was converted. This might happen at the end of a buffer with doChunkedEncoding.
                break;
            }

            if (ShouldFastPath(p, dest)) goto LFastPath;
        }

        pbUtf8 = p;

        return dest - buffer;
    }